

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_decode_memory
               (uchar **out,uint *w,uint *h,uchar *in,size_t insize,LodePNGColorType colortype,
               uint bitdepth)

{
  uint uVar1;
  LodePNGState state;
  uint error;
  undefined4 in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb4;
  LodePNGState *this;
  LodePNGState *in_stack_fffffffffffffdc0;
  uint *in_stack_fffffffffffffdc8;
  _func_int **in_stack_fffffffffffffdd0;
  uchar **in_stack_fffffffffffffdd8;
  
  this = (LodePNGState *)&stack0xfffffffffffffdd0;
  LodePNGState::LodePNGState(this);
  lodepng_state_init((LodePNGState *)0x10d2f7);
  uVar1 = lodepng_decode(in_stack_fffffffffffffdd8,(uint *)in_stack_fffffffffffffdd0,
                         in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,(uchar *)this,
                         CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
  lodepng_state_cleanup((LodePNGState *)0x10d362);
  LodePNGState::~LodePNGState((LodePNGState *)&stack0xfffffffffffffdd0);
  return uVar1;
}

Assistant:

unsigned lodepng_decode_memory(unsigned char** out, unsigned* w, unsigned* h, const unsigned char* in,
                               size_t insize, LodePNGColorType colortype, unsigned bitdepth) {
  unsigned error;
  LodePNGState state;
  lodepng_state_init(&state);
  state.info_raw.colortype = colortype;
  state.info_raw.bitdepth = bitdepth;
  error = lodepng_decode(out, w, h, &state, in, insize);
  lodepng_state_cleanup(&state);
  return error;
}